

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void avx::AbsoluteDifference
               (uint32_t rowSizeIn1,uint32_t rowSizeIn2,uint32_t rowSizeOut,uint8_t *in1Y,
               uint8_t *in2Y,uint8_t *outY,uint8_t *outYEnd,uint32_t simdWidth,
               uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  char cVar3;
  char *pcVar4;
  undefined1 (*in_RCX) [32];
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  undefined1 (*in_R8) [32];
  undefined8 *in_R9;
  undefined8 *in_stack_00000008;
  uint8_t *in2X;
  uint8_t *in1X;
  simd data2;
  simd data1;
  simd *src1End;
  simd *dst;
  simd *src2;
  simd *src1;
  char *local_1f8;
  byte *local_1f0;
  byte *local_1e8;
  undefined8 *local_190;
  undefined1 (*local_188) [32];
  undefined1 (*local_180) [32];
  undefined8 *local_178;
  undefined1 (*local_170) [32];
  undefined1 (*local_168) [32];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  
  local_170 = in_R8;
  local_168 = in_RCX;
  for (local_178 = in_R9; local_178 != in_stack_00000008;
      local_178 = (undefined8 *)((long)local_178 + (ulong)in_EDX)) {
    local_188 = local_170;
    local_190 = local_178;
    for (local_180 = local_168; local_180 != local_168 + ((ulong)outYEnd & 0xffffffff);
        local_180 = local_180 + 1) {
      auVar1 = vpmaxub_avx2(*local_180,*local_188);
      auVar2 = vpminub_avx2(*local_180,*local_188);
      auVar1 = vpsubb_avx2(auVar1,auVar2);
      local_140 = auVar1._0_8_;
      uStack_138 = auVar1._8_8_;
      uStack_130 = auVar1._16_8_;
      uStack_128 = auVar1._24_8_;
      *local_190 = local_140;
      local_190[1] = uStack_138;
      local_190[2] = uStack_130;
      local_190[3] = uStack_128;
      local_188 = local_188 + 1;
      local_190 = local_190 + 4;
    }
    if (totalSimdWidth != 0) {
      local_1e8 = *local_168 + simdWidth;
      local_1f0 = *local_170 + simdWidth;
      local_1f8 = (char *)((long)local_178 + (ulong)simdWidth);
      pcVar4 = local_1f8 + totalSimdWidth;
      for (; local_1f8 != pcVar4; local_1f8 = local_1f8 + 1) {
        if (*local_1e8 < *local_1f0) {
          cVar3 = *local_1f0 - *local_1e8;
        }
        else {
          cVar3 = *local_1e8 - *local_1f0;
        }
        *local_1f8 = cVar3;
        local_1e8 = local_1e8 + 1;
        local_1f0 = local_1f0 + 1;
      }
    }
    local_168 = (undefined1 (*) [32])(*local_168 + in_EDI);
    local_170 = (undefined1 (*) [32])(*local_170 + in_ESI);
  }
  return;
}

Assistant:

void AbsoluteDifference( uint32_t rowSizeIn1, uint32_t rowSizeIn2, uint32_t rowSizeOut, const uint8_t * in1Y, const uint8_t * in2Y,
                             uint8_t * outY, const uint8_t * outYEnd, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        for( ; outY != outYEnd; outY += rowSizeOut, in1Y += rowSizeIn1, in2Y += rowSizeIn2 ) {
            const simd * src1 = reinterpret_cast <const simd*> (in1Y);
            const simd * src2 = reinterpret_cast <const simd*> (in2Y);
            simd       * dst  = reinterpret_cast <simd*> (outY);

            const simd * src1End = src1 + simdWidth;

            for( ; src1 != src1End; ++src1, ++src2, ++dst ) {
                simd data1 = _mm256_loadu_si256( src1 );
                simd data2 = _mm256_loadu_si256( src2 );
                _mm256_storeu_si256( dst, _mm256_sub_epi8( _mm256_max_epu8( data1, data2 ), _mm256_min_epu8( data1, data2 ) ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * in1X = in1Y + totalSimdWidth;
                const uint8_t * in2X = in2Y + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth;

                const uint8_t * outXEnd = outX + nonSimdWidth;

                for( ; outX != outXEnd; ++outX, ++in1X, ++in2X )
                    (*outX) = static_cast<uint8_t>( (*in2X) > (*in1X) ? (*in2X) - (*in1X) : (*in1X) - (*in2X) );
            }
        }
    }